

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_ircode.c
# Opt level: O3

void ircode_patch_init(ircode_t *code,uint16_t index)

{
  uint uVar1;
  code_r *pcVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  inst_t *piVar5;
  inst_t *piVar6;
  inst_t *piVar7;
  inst_t *piVar8;
  code_r *pcVar9;
  inst_t **ppiVar10;
  size_t sVar11;
  undefined6 in_register_00000032;
  size_t sVar12;
  ulong uVar13;
  ulong uVar14;
  
  uVar3 = ircode_register_push_temp(code);
  piVar5 = (inst_t *)gravity_calloc((gravity_vm *)0x0,1,0x28);
  piVar5->op = LOADK;
  piVar5->tag = NO_TAG;
  piVar5->p1 = uVar3;
  piVar5->p2 = (int32_t)CONCAT62(in_register_00000032,index);
  piVar5->p3 = 0;
  piVar5->lineno = 0;
  piVar6 = (inst_t *)gravity_calloc((gravity_vm *)0x0,1,0x28);
  piVar6->op = LOAD;
  piVar6->tag = NO_TAG;
  piVar6->p1 = uVar3;
  piVar6->p2 = 0;
  piVar6->p3 = uVar3;
  piVar6->lineno = 0;
  uVar4 = ircode_register_push_temp(code);
  piVar7 = (inst_t *)gravity_calloc((gravity_vm *)0x0,1,0x28);
  piVar7->op = MOVE;
  piVar7->tag = NO_TAG;
  piVar7->p1 = uVar4;
  piVar7->p2 = 0;
  piVar7->p3 = 0;
  piVar7->lineno = 0;
  sVar11 = (code->registers).n;
  if (sVar11 != 0) {
    (code->registers).n = sVar11 - 1;
    uVar1 = (code->registers).p[sVar11 - 1];
    if (code->nlocals <= uVar1) {
      code->state[uVar1] = false;
    }
  }
  piVar8 = (inst_t *)gravity_calloc((gravity_vm *)0x0,1,0x28);
  piVar8->op = CALL;
  piVar8->tag = NO_TAG;
  piVar8->p1 = uVar3;
  piVar8->p2 = uVar3;
  piVar8->p3 = 1;
  piVar8->lineno = 0;
  sVar11 = (code->registers).n;
  if (sVar11 != 0) {
    (code->registers).n = sVar11 - 1;
    uVar1 = (code->registers).p[sVar11 - 1];
    if (code->nlocals <= uVar1) {
      code->state[uVar1] = false;
    }
  }
  pcVar9 = (code_r *)gravity_calloc((gravity_vm *)0x0,1,0x18);
  pcVar9->m = 8;
  ppiVar10 = (inst_t **)malloc(0x40);
  pcVar9->p = ppiVar10;
  *ppiVar10 = piVar5;
  ppiVar10[1] = piVar6;
  ppiVar10[2] = piVar7;
  pcVar2 = code->list;
  pcVar9->n = 4;
  ppiVar10[3] = piVar8;
  uVar14 = (ulong)(uint)pcVar2->n;
  if (uVar14 != 0) {
    uVar13 = 0;
    sVar11 = 4;
    do {
      piVar5 = pcVar2->p[uVar13];
      ppiVar10 = pcVar9->p;
      if (sVar11 == pcVar9->m) {
        sVar12 = sVar11 * 2;
        if (sVar11 == 0) {
          sVar12 = 8;
        }
        pcVar9->m = sVar12;
        ppiVar10 = (inst_t **)realloc(ppiVar10,sVar12 << 3);
        pcVar9->p = ppiVar10;
        sVar11 = pcVar9->n;
      }
      pcVar9->n = sVar11 + 1;
      ppiVar10[sVar11] = piVar5;
      uVar13 = uVar13 + 1;
      sVar11 = sVar11 + 1;
    } while (uVar14 != uVar13);
  }
  if (pcVar2->p != (inst_t **)0x0) {
    free(pcVar2->p);
  }
  free(code->list);
  code->list = pcVar9;
  return;
}

Assistant:

void ircode_patch_init (ircode_t *code, uint16_t index) {
    // prepend call instructions to code
    // LOADK temp index
    // LOAD  temp 0 temp
    // MOVE  temp+1 0
    // CALL  temp temp 1

    // load constant
    uint32_t dest = ircode_register_push_temp(code);
	inst_t *inst1 = inst_new(LOADK, dest, index, 0, NO_TAG, 0, 0.0, 0);

    // load from lookup
	inst_t *inst2 = inst_new(LOAD, dest, 0, dest, NO_TAG, 0, 0.0, 0);

    // prepare parameter
    uint32_t dest2 = ircode_register_push_temp(code);
	inst_t *inst3 = inst_new(MOVE, dest2, 0, 0, NO_TAG, 0, 0.0, 0);
    ircode_register_pop(code);

    // execute call
	inst_t *inst4 = inst_new(CALL, dest, dest, 1, NO_TAG, 0, 0.0, 0);

    // pop temps used
    ircode_register_pop(code);

    // create new instruction list
    code_r        *list = mem_alloc(NULL, sizeof(code_r));
    marray_init(*list);

    // add newly create instructions
    marray_push(inst_t*, *list, inst1);
    marray_push(inst_t*, *list, inst2);
    marray_push(inst_t*, *list, inst3);
    marray_push(inst_t*, *list, inst4);

    // then copy original instructions
    code_r *orig_list = code->list;
    uint32_t count = ircode_count(code);
    for (uint32_t i=0; i<count; ++i) {
        inst_t *inst = marray_get(*orig_list, i);
        marray_push(inst_t*, *list, inst);
    }

    // free dest list
    marray_destroy(*orig_list);
    mem_free(code->list);

    // replace dest list with the newly created list
    code->list = list;
}